

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json-validator.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_3648a::logical_not::validate
          (logical_not *this,json_pointer *ptr,json *instance,json_patch *patch,error_handler *e)

{
  element_type *peVar1;
  first_error_handler esub;
  allocator<char> local_a9;
  string local_a8 [32];
  first_error_handler local_88;
  
  first_error_handler::first_error_handler(&local_88);
  peVar1 = (this->subschema_).
           super___shared_ptr<(anonymous_namespace)::schema,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (*peVar1->_vptr_schema[3])(peVar1,ptr,instance,patch,&local_88);
  if (local_88.error_ == false) {
    std::__cxx11::string::string<std::allocator<char>>
              (local_a8,"the subschema has succeeded, but it is required to not validate",&local_a9)
    ;
    (*e->_vptr_error_handler[2])(e,ptr,instance,local_a8);
    std::__cxx11::string::~string(local_a8);
  }
  first_error_handler::~first_error_handler(&local_88);
  return;
}

Assistant:

void validate(const json::json_pointer &ptr, const json &instance, json_patch &patch, error_handler &e) const final
	{
		first_error_handler esub;
		subschema_->validate(ptr, instance, patch, esub);

		if (!esub)
			e.error(ptr, instance, "the subschema has succeeded, but it is required to not validate");
	}